

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

void add_weapon_skill(int n)

{
  boolean bVar1;
  undefined4 local_18;
  undefined4 local_14;
  int after;
  int before;
  int i;
  int n_local;
  
  local_14 = 0;
  for (after = 0; after < 0x2a; after = after + 1) {
    bVar1 = can_advance(after,'\0');
    if (bVar1 != '\0') {
      local_14 = local_14 + 1;
    }
  }
  u.weapon_slots = n + u.weapon_slots;
  local_18 = 0;
  for (after = 0; after < 0x2a; after = after + 1) {
    bVar1 = can_advance(after,'\0');
    if (bVar1 != '\0') {
      local_18 = local_18 + 1;
    }
  }
  if (local_14 < local_18) {
    give_may_advance_msg(0);
  }
  return;
}

Assistant:

void add_weapon_skill(int n)
{
    int i, before, after;

    for (i = 0, before = 0; i < P_NUM_SKILLS; i++)
	if (can_advance(i, FALSE)) before++;
    u.weapon_slots += n;
    for (i = 0, after = 0; i < P_NUM_SKILLS; i++)
	if (can_advance(i, FALSE)) after++;
    if (before < after)
	give_may_advance_msg(P_NONE);
}